

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# istream.cc
# Opt level: O3

void __thiscall
wabt::interp::Istream::Disassemble(Istream *this,Stream *stream,Offset from,Offset to)

{
  ulong uVar1;
  DisassemblySource source;
  TraceSource local_28;
  
  local_28._vptr_TraceSource = (_func_int **)&PTR__TraceSource_00225b80;
  uVar1 = (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                _M_impl.super__Vector_impl_data._M_start;
  if (((from <= uVar1) && (from <= to)) && (to <= uVar1)) {
    if (from < to) {
      do {
        from = Trace(this,stream,from,&local_28);
      } while (from < to);
    }
    return;
  }
  __assert_fail("from <= data_.size() && to <= data_.size() && from <= to",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/interp/istream.cc"
                ,0x336,"void wabt::interp::Istream::Disassemble(Stream *, Offset, Offset) const");
}

Assistant:

void Istream::Disassemble(Stream* stream, Offset from, Offset to) const {
  DisassemblySource source;
  assert(from <= data_.size() && to <= data_.size() && from <= to);

  Offset pc = from;
  while (pc < to) {
    pc = Trace(stream, pc, &source);
  }
}